

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O1

uint64_t aom_var_2d_u16_c(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  if (height < 1) {
    lVar3 = 0;
    lVar2 = 0;
  }
  else {
    lVar4 = (long)src * 2;
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          uVar1 = *(ushort *)(lVar4 + uVar6 * 2);
          lVar2 = lVar2 + (ulong)uVar1;
          lVar3 = lVar3 + (ulong)((uint)uVar1 * (uint)uVar1);
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      iVar5 = iVar5 + 1;
      lVar4 = lVar4 + (long)src_stride * 2;
    } while (iVar5 != height);
  }
  return lVar3 - (ulong)(lVar2 * lVar2) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u16_c(uint8_t *src, int src_stride, int width, int height) {
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint16_t v = srcp[c];
      ss += v * v;
      s += v;
    }
    srcp += src_stride;
  }

  return (ss - s * s / (width * height));
}